

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockchain.cpp
# Opt level: O0

optional<int> GetPruneHeight(BlockManager *blockman,CChain *chain)

{
  BlockManager *this;
  CBlockIndex *pCVar1;
  CBlockIndex **ppCVar2;
  long in_FS_OFFSET;
  char *unaff_retaddr;
  CBlockIndex **in_stack_00000008;
  CBlockIndex *first_unpruned;
  CBlockIndex *chain_tip;
  CBlockIndex *first_block;
  undefined8 in_stack_ffffffffffffffa8;
  int *in_stack_ffffffffffffffb0;
  CBlockIndex *in_stack_ffffffffffffffb8;
  BlockManager *this_00;
  undefined4 in_stack_ffffffffffffffc0;
  uint32_t in_stack_ffffffffffffffc4;
  _Optional_payload_base<int> in_stack_fffffffffffffff0;
  long lVar3;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  AssertLockHeldInternal<AnnotatedMixin<std::recursive_mutex>>
            ((char *)in_stack_ffffffffffffffb8,(char *)in_stack_ffffffffffffffb0,
             (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
             (AnnotatedMixin<std::recursive_mutex> *)0x53e83f);
  this = (BlockManager *)
         CChain::operator[]((CChain *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                            (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
  pCVar1 = CChain::Tip((CChain *)in_stack_ffffffffffffffb8);
  if ((this == (BlockManager *)0x0) || (pCVar1 == (CBlockIndex *)0x0)) {
    std::optional<int>::optional((optional<int> *)&stack0xfffffffffffffff0);
  }
  else if ((pCVar1->nStatus & 0x18) == 0x18) {
    pCVar1 = node::BlockManager::GetFirstBlock
                       (this,pCVar1,in_stack_ffffffffffffffc4,in_stack_ffffffffffffffb8);
    ppCVar2 = inline_check_non_fatal<CBlockIndex_const*>
                        (in_stack_00000008,unaff_retaddr,(int)((ulong)lVar3 >> 0x20),
                         (char *)in_stack_fffffffffffffff0,(char *)pCVar1);
    this_00 = (BlockManager *)*ppCVar2;
    if (this_00 == this) {
      std::optional<int>::optional((optional<int> *)&stack0xfffffffffffffff0);
    }
    else {
      inline_check_non_fatal<CBlockIndex*const&>
                (in_stack_00000008,unaff_retaddr,(int)((ulong)lVar3 >> 0x20),
                 (char *)in_stack_fffffffffffffff0,(char *)pCVar1);
      std::optional<int>::optional<int_&,_true>((optional<int> *)this_00,in_stack_ffffffffffffffb0);
    }
  }
  else {
    std::optional<int>::optional<const_int_&,_true>
              ((optional<int> *)in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return (optional<int>)in_stack_fffffffffffffff0;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<int> GetPruneHeight(const BlockManager& blockman, const CChain& chain) {
    AssertLockHeld(::cs_main);

    // Search for the last block missing block data or undo data. Don't let the
    // search consider the genesis block, because the genesis block does not
    // have undo data, but should not be considered pruned.
    const CBlockIndex* first_block{chain[1]};
    const CBlockIndex* chain_tip{chain.Tip()};

    // If there are no blocks after the genesis block, or no blocks at all, nothing is pruned.
    if (!first_block || !chain_tip) return std::nullopt;

    // If the chain tip is pruned, everything is pruned.
    if (!((chain_tip->nStatus & BLOCK_HAVE_MASK) == BLOCK_HAVE_MASK)) return chain_tip->nHeight;

    const auto& first_unpruned{*CHECK_NONFATAL(blockman.GetFirstBlock(*chain_tip, /*status_mask=*/BLOCK_HAVE_MASK, first_block))};
    if (&first_unpruned == first_block) {
        // All blocks between first_block and chain_tip have data, so nothing is pruned.
        return std::nullopt;
    }

    // Block before the first unpruned block is the last pruned block.
    return CHECK_NONFATAL(first_unpruned.pprev)->nHeight;
}